

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::get_executable_path_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_2041;
  ssize_t local_2040;
  ssize_t ret;
  char *ext;
  char **__end1;
  char **__begin1;
  char *(*__range1) [3];
  char target [4096];
  char link_path [4096];
  
  __begin1 = get_executable_path::exts;
  __end1 = get_executable_path::exts;
  ext = &DAT_005318e8;
  ret = (ssize_t)get_executable_path::exts[0];
  snprintf(target + 0xff8,0x1000,"/proc/self/%s",get_executable_path::exts[0]);
  local_2040 = readlink(target + 0xff8,(char *)&__range1,0xfff);
  if (-1 < local_2040) {
    target[local_2040 + -8] = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)&__range1,&local_2041);
  std::allocator<char>::~allocator((allocator<char> *)&local_2041);
  return in_RDI;
}

Assistant:

string get_executable_path()
{
#ifdef _WIN32
	char target[4096];
	DWORD ret = GetModuleFileNameA(GetModuleHandle(nullptr), target, sizeof(target));
	target[ret] = '\0';
	return canonicalize_path(string(target));
#else
	static const char *exts[] = { "exe", "file", "a.out" };
	char link_path[PATH_MAX];
	char target[PATH_MAX];

	for (auto *ext : exts)
	{
		snprintf(link_path, sizeof(link_path), "/proc/self/%s", ext);
		ssize_t ret = readlink(link_path, target, sizeof(target) - 1);
		if (ret >= 0)
			target[ret] = '\0';

		return string(target);
	}

	return "";
#endif
}